

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportEnumerator.cpp
# Opt level: O3

void __thiscall axl::spy::ImportIteratorBase::reset(ImportIteratorBase *this)

{
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_38;
  
  local_38.m_length._0_1_ = 0;
  local_38.m_length._1_7_ = 0;
  local_38.m_isNullTerminated = false;
  local_38.m_p = (C *)0x0;
  local_38.m_hdr._0_1_ = 0;
  local_38.m_hdr._1_7_ = 0;
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr(&local_38,(BufHdr *)0x0);
  local_38.m_p = (C *)0x0;
  local_38.m_length._0_1_ = 0;
  local_38.m_length._1_7_ = 0;
  local_38.m_isNullTerminated = false;
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::move(&this->m_symbolName,&local_38);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_38);
  local_38.m_length._0_1_ = 0;
  local_38.m_length._1_7_ = 0;
  local_38.m_isNullTerminated = false;
  local_38.m_p = (C *)0x0;
  local_38.m_hdr._0_1_ = 0;
  local_38.m_hdr._1_7_ = 0;
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr(&local_38,(BufHdr *)0x0);
  local_38.m_p = (C *)0x0;
  local_38.m_length._0_1_ = 0;
  local_38.m_length._1_7_ = 0;
  local_38.m_isNullTerminated = false;
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::move(&this->m_moduleName,&local_38);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_38);
  this->m_slot = (void **)0x0;
  return;
}

Assistant:

void
ImportIteratorBase::reset() {
	m_symbolName = NULL;
	m_moduleName = NULL;
	m_slot = NULL;
}